

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O2

int32 mgau_precomp(mgau_model_t *g)

{
  float fVar1;
  float32 **ainv;
  mgau_t *pmVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  float64 __x;
  double dVar7;
  double dVar8;
  
  if (g->verbose != 0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
            ,0x362,"Precomputing Mahalanobis distance invariants\n");
  }
  lVar6 = 0;
  do {
    if (g->n_mgau <= lVar6) {
      return 0;
    }
    pmVar2 = g->mgau;
    for (lVar4 = 0; lVar4 < pmVar2[lVar6].n_comp; lVar4 = lVar4 + 1) {
      if (pmVar2[lVar6].fullvar == (float32 ***)0x0) {
        dVar7 = 0.0;
        for (lVar5 = 0; iVar3 = g->veclen, lVar5 < iVar3; lVar5 = lVar5 + 1) {
          dVar8 = log((double)(float)pmVar2[lVar6].var[lVar4][lVar5]);
          pmVar2 = g->mgau;
          fVar1 = (float)pmVar2[lVar6].var[lVar4][lVar5];
          dVar7 = dVar7 + dVar8;
          pmVar2[lVar6].var[lVar4][lVar5] = (float32)(1.0 / (fVar1 + fVar1));
        }
      }
      else {
        __x = determinant(pmVar2[lVar6].fullvar[lVar4],g->veclen);
        if ((double)__x <= 0.0) {
          __assert_fail("lrd > 0.0",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                        ,0x36b,"int32 mgau_precomp(mgau_model_t *)");
        }
        dVar7 = log((double)__x);
        ainv = g->mgau[lVar6].fullvar[lVar4];
        invert(ainv,ainv,g->veclen);
        iVar3 = g->veclen;
        pmVar2 = g->mgau;
      }
      pmVar2[lVar6].lrd[lVar4] =
           (float32)(float)(((double)iVar3 * 1.8378770664093453 + dVar7) * -0.5);
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

int32
mgau_precomp(mgau_model_t * g)
{
    int32 m, c, i;
    float64 lrd;

    if (g->verbose)
        E_INFO("Precomputing Mahalanobis distance invariants\n");

    for (m = 0; m < mgau_n_mgau(g); m++) {
        for (c = 0; c < mgau_n_comp(g, m); c++) {
            if (g->mgau[m].fullvar) {
                lrd = determinant(g->mgau[m].fullvar[c], mgau_veclen(g));
                /* E_INFO("covariance mgau %d comp %d determinant = %g\n",
                   m, c, lrd); */
                /* Shouldn't happen, since we removed them earlier */
                assert(lrd > 0.0);
                lrd = log(lrd);
                invert(g->mgau[m].fullvar[c], g->mgau[m].fullvar[c],
                       mgau_veclen(g));
                /* Not doubling it here. */
            }
            else {
                lrd = 0.0;
                for (i = 0; i < mgau_veclen(g); i++) {
                    lrd += log(g->mgau[m].var[c][i]);

                    /* Precompute this part of the exponential */
                    g->mgau[m].var[c][i] =
                        (float32) (1.0 / (g->mgau[m].var[c][i] * 2.0));
                }
            }
            lrd += mgau_veclen(g) * log(2.0 * M_PI);      /* (2pi)^velen */
            mgau_lrd(g, m, c) = (float32) (-0.5 * lrd); /* Reciprocal, sqrt */
        }
    }

    return 0;
}